

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sse_sse4.c
# Opt level: O0

int64_t aom_highbd_sse_sse4_1
                  (uint8_t *a8,int a_stride,uint8_t *b8,int b_stride,int width,int height)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  long in_RDX;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong lVar3;
  int in_ESI;
  __m128i *palVar4;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  __m128i v;
  __m128i v_00;
  __m128i v_01;
  __m128i v_02;
  __m128i v_03;
  int i_1;
  __m128i sum32_5;
  int l_4;
  int i;
  __m128i sum32_4;
  __m128i sum32_3;
  int l_3;
  __m128i sum32_2;
  int l_2;
  __m128i sum32_1;
  int l_1;
  __m128i sum32;
  int l;
  __m128i sum;
  uint16_t *b;
  uint16_t *a;
  int64_t sse;
  int32_t y;
  bool local_225;
  bool local_224;
  bool local_223;
  bool local_222;
  bool local_221;
  int local_21c;
  longlong local_218 [3];
  int local_200;
  int local_1fc;
  uint16_t *in_stack_fffffffffffffe08;
  uint16_t *b_00;
  uint16_t *in_stack_fffffffffffffe10;
  uint16_t *a_00;
  __m128i *in_stack_fffffffffffffe18;
  int local_1cc;
  longlong local_1c8 [2];
  int in_stack_fffffffffffffe4c;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  longlong in_stack_fffffffffffffe58;
  uint16_t *in_stack_fffffffffffffe60;
  __m128i *in_stack_fffffffffffffe68;
  int local_18c;
  longlong local_188 [3];
  int local_16c;
  longlong local_168;
  longlong lStack_160;
  long local_158;
  long local_150;
  int64_t local_148;
  int local_140;
  int local_13c;
  uint local_138;
  int local_134;
  int local_124;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  longlong local_a8;
  undefined8 uStack_a0;
  longlong local_98;
  longlong lStack_90;
  longlong local_88;
  undefined8 uStack_80;
  longlong local_78;
  longlong lStack_70;
  longlong local_68;
  undefined8 uStack_60;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  undefined8 uStack_40;
  longlong local_38;
  longlong lStack_30;
  longlong local_28;
  undefined8 uStack_20;
  longlong local_18;
  longlong lStack_10;
  
  local_140 = 0;
  local_148 = 0;
  local_150 = in_RDI * 2;
  local_158 = in_RDX * 2;
  local_b8 = 0;
  uStack_b0 = 0;
  local_168 = 0;
  lStack_160 = 0;
  local_13c = in_R9D;
  local_134 = in_ECX;
  local_124 = in_ESI;
  if (in_R8D == 4) {
    do {
      highbd_sse_w4x2_sse4_1
                (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                 (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                 (uint16_t *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 in_stack_fffffffffffffe4c);
      local_150 = local_150 + (long)(local_124 << 1) * 2;
      local_158 = local_158 + (long)(local_134 << 1) * 2;
      local_140 = local_140 + 2;
    } while (local_140 < local_13c);
    local_148 = summary_all_sse4(in_stack_fffffffffffffe18);
  }
  else if (in_R8D == 8) {
    do {
      highbd_sse_w8_sse4_1
                (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      local_150 = local_150 + (long)local_124 * 2;
      local_158 = local_158 + (long)local_134 * 2;
      local_140 = local_140 + 1;
    } while (local_140 < local_13c);
    local_148 = summary_all_sse4(in_stack_fffffffffffffe18);
  }
  else if (in_R8D == 0x10) {
    do {
      local_16c = 0;
      local_c8 = 0;
      uStack_c0 = 0;
      local_188[0] = 0;
      local_188[1] = 0;
      do {
        highbd_sse_w8_sse4_1
                  (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        highbd_sse_w8_sse4_1
                  (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        local_150 = local_150 + (long)local_124 * 2;
        local_158 = local_158 + (long)local_134 * 2;
        local_16c = local_16c + 1;
        local_221 = local_16c < 0x40 && local_16c < local_13c - local_140;
      } while (local_221);
      palVar4 = (__m128i *)&local_168;
      summary_32_sse4((__m128i *)local_188,palVar4);
      local_140 = local_140 + 0x40;
    } while (local_140 < local_13c);
    local_18 = local_168;
    lStack_10 = lStack_160;
    local_28 = lStack_160;
    uStack_20 = 0;
    v[1] = extraout_RDX;
    v[0] = (longlong)palVar4;
    xx_storel_64(&local_148,v);
  }
  else if (in_R8D == 0x20) {
    do {
      local_18c = 0;
      local_d8 = 0;
      uStack_d0 = 0;
      do {
        highbd_sse_w8_sse4_1
                  (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        highbd_sse_w8_sse4_1
                  (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        highbd_sse_w8_sse4_1
                  (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        highbd_sse_w8_sse4_1
                  (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        local_150 = local_150 + (long)local_124 * 2;
        local_158 = local_158 + (long)local_134 * 2;
        local_18c = local_18c + 1;
        local_222 = local_18c < 0x20 && local_18c < local_13c - local_140;
      } while (local_222);
      palVar4 = (__m128i *)&local_168;
      summary_32_sse4((__m128i *)&stack0xfffffffffffffe58,palVar4);
      local_140 = local_140 + 0x20;
    } while (local_140 < local_13c);
    local_38 = local_168;
    lStack_30 = lStack_160;
    local_48 = lStack_160;
    uStack_40 = 0;
    v_00[1] = extraout_RDX_00;
    v_00[0] = (longlong)palVar4;
    xx_storel_64(&local_148,v_00);
  }
  else if (in_R8D == 0x40) {
    do {
      iVar1 = 0;
      local_e8 = 0;
      uStack_e0 = 0;
      local_1c8[0] = 0;
      local_1c8[1] = 0;
      do {
        highbd_sse_w8_sse4_1
                  (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        highbd_sse_w8_sse4_1
                  (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        highbd_sse_w8_sse4_1
                  (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        highbd_sse_w8_sse4_1
                  (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        highbd_sse_w8_sse4_1
                  (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        highbd_sse_w8_sse4_1
                  (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        highbd_sse_w8_sse4_1
                  (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        highbd_sse_w8_sse4_1
                  (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        local_150 = local_150 + (long)local_124 * 2;
        local_158 = local_158 + (long)local_134 * 2;
        iVar1 = iVar1 + 1;
        local_223 = iVar1 < 0x10 && iVar1 < local_13c - local_140;
      } while (local_223);
      palVar4 = (__m128i *)&local_168;
      summary_32_sse4(&local_1c8,palVar4);
      local_140 = local_140 + 0x10;
    } while (local_140 < local_13c);
    local_58 = local_168;
    lStack_50 = lStack_160;
    local_68 = lStack_160;
    uStack_60 = 0;
    v_01[1] = extraout_RDX_01;
    v_01[0] = (longlong)palVar4;
    xx_storel_64(&local_148,v_01);
  }
  else if (in_R8D == 0x80) {
    do {
      local_1cc = 0;
      local_f8 = 0;
      uStack_f0 = 0;
      palVar4 = (__m128i *)0x0;
      do {
        highbd_sse_w8_sse4_1(palVar4,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        highbd_sse_w8_sse4_1(palVar4,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        highbd_sse_w8_sse4_1(palVar4,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        highbd_sse_w8_sse4_1(palVar4,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        highbd_sse_w8_sse4_1(palVar4,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        highbd_sse_w8_sse4_1(palVar4,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        highbd_sse_w8_sse4_1(palVar4,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        highbd_sse_w8_sse4_1(palVar4,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        highbd_sse_w8_sse4_1(palVar4,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        highbd_sse_w8_sse4_1(palVar4,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        highbd_sse_w8_sse4_1(palVar4,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        highbd_sse_w8_sse4_1(palVar4,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        highbd_sse_w8_sse4_1(palVar4,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        highbd_sse_w8_sse4_1(palVar4,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        highbd_sse_w8_sse4_1(palVar4,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        highbd_sse_w8_sse4_1(palVar4,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        local_150 = local_150 + (long)local_124 * 2;
        local_158 = local_158 + (long)local_134 * 2;
        local_1cc = local_1cc + 1;
        local_224 = local_1cc < 8 && local_1cc < local_13c - local_140;
      } while (local_224);
      palVar4 = (__m128i *)&local_168;
      summary_32_sse4((__m128i *)&stack0xfffffffffffffe18,palVar4);
      local_140 = local_140 + 8;
    } while (local_140 < local_13c);
    local_78 = local_168;
    lStack_70 = lStack_160;
    local_88 = lStack_160;
    uStack_80 = 0;
    v_02[1] = extraout_RDX_02;
    v_02[0] = (longlong)palVar4;
    xx_storel_64(&local_148,v_02);
  }
  else {
    local_138 = in_R8D;
    if ((in_R8D & 7) == 0) {
      do {
        local_200 = 0;
        local_118 = 0;
        uStack_110 = 0;
        local_218[0] = 0;
        local_218[1] = 0;
        do {
          local_21c = 0;
          do {
            highbd_sse_w8_sse4_1
                      (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08
                      );
            local_21c = local_21c + 8;
          } while (local_21c < (int)local_138);
          local_150 = local_150 + (long)local_124 * 2;
          local_158 = local_158 + (long)local_134 * 2;
          local_200 = local_200 + 1;
          local_225 = local_200 < 8 && local_200 < local_13c - local_140;
        } while (local_225);
        palVar4 = (__m128i *)&local_168;
        summary_32_sse4((__m128i *)local_218,palVar4);
        local_140 = local_140 + 8;
        lVar3 = extraout_RDX_04;
      } while (local_140 < local_13c);
    }
    else {
      do {
        local_108 = 0;
        uStack_100 = 0;
        b_00 = (uint16_t *)0x0;
        a_00 = (uint16_t *)0x0;
        local_1fc = 0;
        do {
          highbd_sse_w8_sse4_1(in_stack_fffffffffffffe18,a_00,b_00);
          highbd_sse_w8_sse4_1(in_stack_fffffffffffffe18,a_00,b_00);
          iVar1 = local_1fc + 8;
          iVar2 = local_1fc + 0xc;
          local_1fc = iVar1;
        } while (iVar2 < (int)local_138);
        highbd_sse_w4x2_sse4_1
                  (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                   (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                   (uint16_t *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                   in_stack_fffffffffffffe4c);
        local_150 = local_150 + (long)(local_124 << 1) * 2;
        local_158 = local_158 + (long)(local_134 << 1) * 2;
        local_140 = local_140 + 2;
        palVar4 = (__m128i *)&local_168;
        summary_32_sse4((__m128i *)&stack0xfffffffffffffe08,palVar4);
        lVar3 = extraout_RDX_03;
      } while (local_140 < local_13c);
    }
    local_98 = local_168;
    lStack_90 = lStack_160;
    local_a8 = lStack_160;
    uStack_a0 = 0;
    v_03[1] = lVar3;
    v_03[0] = (longlong)palVar4;
    xx_storel_64(&local_148,v_03);
  }
  return local_148;
}

Assistant:

int64_t aom_highbd_sse_sse4_1(const uint8_t *a8, int a_stride,
                              const uint8_t *b8, int b_stride, int width,
                              int height) {
  int32_t y = 0;
  int64_t sse = 0;
  uint16_t *a = CONVERT_TO_SHORTPTR(a8);
  uint16_t *b = CONVERT_TO_SHORTPTR(b8);
  __m128i sum = _mm_setzero_si128();
  switch (width) {
    case 4:
      do {
        highbd_sse_w4x2_sse4_1(&sum, a, a_stride, b, b_stride);
        a += a_stride << 1;
        b += b_stride << 1;
        y += 2;
      } while (y < height);
      sse = summary_all_sse4(&sum);
      break;
    case 8:
      do {
        highbd_sse_w8_sse4_1(&sum, a, b);
        a += a_stride;
        b += b_stride;
        y += 1;
      } while (y < height);
      sse = summary_all_sse4(&sum);
      break;
    case 16:
      do {
        int l = 0;
        __m128i sum32 = _mm_setzero_si128();
        do {
          highbd_sse_w8_sse4_1(&sum32, a, b);
          highbd_sse_w8_sse4_1(&sum32, a + 8, b + 8);
          a += a_stride;
          b += b_stride;
          l += 1;
        } while (l < 64 && l < (height - y));
        summary_32_sse4(&sum32, &sum);
        y += 64;
      } while (y < height);
      xx_storel_64(&sse, _mm_add_epi64(sum, _mm_srli_si128(sum, 8)));
      break;
    case 32:
      do {
        int l = 0;
        __m128i sum32 = _mm_setzero_si128();
        do {
          highbd_sse_w8_sse4_1(&sum32, a, b);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 1, b + 8 * 1);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 2, b + 8 * 2);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 3, b + 8 * 3);
          a += a_stride;
          b += b_stride;
          l += 1;
        } while (l < 32 && l < (height - y));
        summary_32_sse4(&sum32, &sum);
        y += 32;
      } while (y < height);
      xx_storel_64(&sse, _mm_add_epi64(sum, _mm_srli_si128(sum, 8)));
      break;
    case 64:
      do {
        int l = 0;
        __m128i sum32 = _mm_setzero_si128();
        do {
          highbd_sse_w8_sse4_1(&sum32, a, b);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 1, b + 8 * 1);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 2, b + 8 * 2);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 3, b + 8 * 3);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 4, b + 8 * 4);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 5, b + 8 * 5);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 6, b + 8 * 6);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 7, b + 8 * 7);
          a += a_stride;
          b += b_stride;
          l += 1;
        } while (l < 16 && l < (height - y));
        summary_32_sse4(&sum32, &sum);
        y += 16;
      } while (y < height);
      xx_storel_64(&sse, _mm_add_epi64(sum, _mm_srli_si128(sum, 8)));
      break;
    case 128:
      do {
        int l = 0;
        __m128i sum32 = _mm_setzero_si128();
        do {
          highbd_sse_w8_sse4_1(&sum32, a, b);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 1, b + 8 * 1);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 2, b + 8 * 2);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 3, b + 8 * 3);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 4, b + 8 * 4);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 5, b + 8 * 5);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 6, b + 8 * 6);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 7, b + 8 * 7);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 8, b + 8 * 8);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 9, b + 8 * 9);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 10, b + 8 * 10);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 11, b + 8 * 11);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 12, b + 8 * 12);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 13, b + 8 * 13);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 14, b + 8 * 14);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 15, b + 8 * 15);
          a += a_stride;
          b += b_stride;
          l += 1;
        } while (l < 8 && l < (height - y));
        summary_32_sse4(&sum32, &sum);
        y += 8;
      } while (y < height);
      xx_storel_64(&sse, _mm_add_epi64(sum, _mm_srli_si128(sum, 8)));
      break;
    default:
      if (width & 0x7) {
        do {
          __m128i sum32 = _mm_setzero_si128();
          int i = 0;
          do {
            highbd_sse_w8_sse4_1(&sum32, a + i, b + i);
            highbd_sse_w8_sse4_1(&sum32, a + i + a_stride, b + i + b_stride);
            i += 8;
          } while (i + 4 < width);
          highbd_sse_w4x2_sse4_1(&sum32, a + i, a_stride, b + i, b_stride);
          a += (a_stride << 1);
          b += (b_stride << 1);
          y += 2;
          summary_32_sse4(&sum32, &sum);
        } while (y < height);
      } else {
        do {
          int l = 0;
          __m128i sum32 = _mm_setzero_si128();
          do {
            int i = 0;
            do {
              highbd_sse_w8_sse4_1(&sum32, a + i, b + i);
              i += 8;
            } while (i < width);
            a += a_stride;
            b += b_stride;
            l += 1;
          } while (l < 8 && l < (height - y));
          summary_32_sse4(&sum32, &sum);
          y += 8;
        } while (y < height);
      }
      xx_storel_64(&sse, _mm_add_epi64(sum, _mm_srli_si128(sum, 8)));
      break;
  }
  return sse;
}